

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O1

int p256_init_key(EVP_HPKE_KEY *key,uint8_t *priv_key,size_t priv_key_len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  
  if (priv_key_len == 0x20) {
    iVar4 = p256_public_from_private(key->public_key,priv_key);
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      uVar1 = *(undefined8 *)priv_key;
      uVar2 = *(undefined8 *)(priv_key + 8);
      uVar3 = *(undefined8 *)(priv_key + 0x18);
      *(undefined8 *)(key->private_key + 0x10) = *(undefined8 *)(priv_key + 0x10);
      *(undefined8 *)(key->private_key + 0x18) = uVar3;
      *(undefined8 *)key->private_key = uVar1;
      *(undefined8 *)(key->private_key + 8) = uVar2;
      iVar4 = 1;
    }
  }
  else {
    iVar4 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                  ,0x160);
  }
  return iVar4;
}

Assistant:

static int p256_init_key(EVP_HPKE_KEY *key, const uint8_t *priv_key,
                         size_t priv_key_len) {
  if (priv_key_len != P256_PRIVATE_KEY_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  if (!p256_public_from_private(key->public_key, priv_key)) {
    return 0;
  }

  OPENSSL_memcpy(key->private_key, priv_key, priv_key_len);
  return 1;
}